

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O2

ssize_t __thiscall HttpConn::write(HttpConn *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  Channel *this_00;
  EventLoop *this_01;
  ulong in_RAX;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  undefined1 local_1010 [4056];
  Functor local_38;
  
  if (this->writeable_ == true) {
    uVar1 = this->write_idx_;
    in_RAX = (ulong)uVar1;
    uVar2 = this->send_idx_;
    if (uVar1 != uVar2) {
      in_RAX = writen(this->fd_,
                      (this->writeBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + (int)uVar2,(long)(int)(uVar1 - uVar2));
      if ((int)in_RAX < 0) {
        Logger::Logger((Logger *)local_1010,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/HttpConn.cpp"
                       ,0x8c);
        LogStream::operator<<((LogStream *)local_1010,"Http Response Error: HttpConn::write()");
        Logger::~Logger((Logger *)local_1010);
        in_RAX = extraout_RAX;
      }
      else {
        this->send_idx_ = this->send_idx_ + (int)in_RAX;
      }
    }
  }
  if ((this->parseState_ == Finished) &&
     (in_RAX = (ulong)(uint)this->write_idx_, this->write_idx_ == this->send_idx_)) {
    if ((this->connStatus_ == Connected) && (this->linger_ == true)) {
      reset(this);
      Channel::update((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
      in_RAX = extraout_RAX_00;
    }
    else {
      this_00 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00->events_ = 0;
      Channel::update(this_00);
      this_01 = this->loop_;
      local_1010._0_8_ = close;
      local_1010[8] = '\0';
      local_1010[9] = '\0';
      local_1010[10] = '\0';
      local_1010[0xb] = '\0';
      local_1010[0xc] = '\0';
      local_1010[0xd] = '\0';
      local_1010[0xe] = '\0';
      local_1010[0xf] = '\0';
      local_1010._16_8_ = this;
      std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
                ((function<void()> *)&local_38,(_Bind<void_(HttpConn::*(HttpConn_*))()> *)local_1010
                );
      EventLoop::runInLoop(this_01,&local_38);
      std::_Function_base::~_Function_base(&local_38.super__Function_base);
      in_RAX = extraout_RAX_01;
    }
  }
  return in_RAX;
}

Assistant:

void HttpConn::write() {
    if (writeable_ && write_idx_ != send_idx_) {
        int writeBytes;
        if ((writeBytes = writen(fd_, writeBuff_.data() + send_idx_, write_idx_ - send_idx_)) < 0) {
            LOG << "Http Response Error: HttpConn::write()";
        } else {
            send_idx_ += writeBytes;
        }
    }

    if (parseState_ == Finished && write_idx_ == send_idx_) {
        if (connStatus_ == Connected && linger_) {
            reset();
            channel_->update();
        } else {
            channel_->setEvent(0);
            channel_->update();
            loop_->runInLoop(std::bind(&HttpConn::close, this));
            return;
        }
    }
    //handleConn();
}